

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# conversion.cpp
# Opt level: O0

void __thiscall
booster::locale::impl_icu::utf8_converter_impl::~utf8_converter_impl(utf8_converter_impl *this)

{
  undefined8 *in_RDI;
  
  *in_RDI = &PTR__utf8_converter_impl_002eab48;
  raii_casemap::~raii_casemap((raii_casemap *)0x263b0a);
  std::__cxx11::string::~string((string *)(in_RDI + 2));
  converter<char>::~converter((converter<char> *)0x263b22);
  return;
}

Assistant:

utf8_converter_impl(cdata const &d) :
            locale_id_(d.locale.getName()),
            map_(locale_id_)
        {
        }